

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int openDirectory(char *zFilename,int *pFd)

{
  uint uVar1;
  int __fd;
  char zDirname [513];
  char acStack_218 [520];
  
  uVar1 = Systrcpy(acStack_218,0x201,zFilename,0);
  if (1 < uVar1) {
    do {
      if (acStack_218[uVar1] == '/') goto LAB_0010f8d7;
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
    uVar1 = 1;
  }
LAB_0010f8d7:
  if (uVar1 == 0) {
    __fd = -1;
  }
  else {
    acStack_218[uVar1] = '\0';
    __fd = open(acStack_218,0,0);
    if (-1 < __fd) {
      uVar1 = fcntl(__fd,1,0);
      fcntl(__fd,2,(ulong)(uVar1 | 1));
    }
  }
  *pFd = __fd;
  return __fd >> 0x1f & 0xfffffffe;
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  sxu32 ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];
  sxu32 n;
  n = Systrcpy(zDirname,sizeof(zDirname),zFilename,0);
  for(ii=n; ii>1 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
    fd = open(zDirname, O_RDONLY|O_BINARY, 0);
    if( fd>=0 ){
#ifdef FD_CLOEXEC
      fcntl(fd, F_SETFD, fcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif
    }
  }
  *pFd = fd;
  return (fd>=0?UNQLITE_OK: UNQLITE_IOERR );
}